

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O2

long dprintf_DollarString(char *input,char **end)

{
  byte bVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  char *pcVar5;
  
  ppuVar3 = __ctype_b_loc();
  pcVar5 = input + 1;
  iVar2 = 0;
  while (bVar1 = pcVar5[-1], (*(byte *)((long)*ppuVar3 + (ulong)bVar1 * 2 + 1) & 8) != 0) {
    iVar2 = iVar2 * 10 + (int)(char)bVar1 + -0x30;
    pcVar5 = pcVar5 + 1;
  }
  if (bVar1 == 0x24 && iVar2 != 0) {
    *end = pcVar5;
    lVar4 = (long)iVar2;
  }
  else {
    lVar4 = 0;
  }
  return lVar4;
}

Assistant:

static long dprintf_DollarString(char *input, char **end)
{
  int number=0;
  while(ISDIGIT(*input)) {
    number *= 10;
    number += *input-'0';
    input++;
  }
  if(number && ('$'==*input++)) {
    *end = input;
    return number;
  }
  return 0;
}